

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRImageFromFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  reference __ptr;
  EXRImage *exr_image_00;
  EXRHeader *exr_header_00;
  undefined8 *in_RCX;
  char *in_RDX;
  uchar *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  FILE *fp;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  allocator_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  size_t local_38;
  FILE *local_30;
  undefined8 *local_28;
  uchar *local_18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  int local_4;
  
  if (in_RDI == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = "Invalid argument.";
    }
    local_4 = -3;
  }
  else {
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_30 = fopen(in_RDX,"rb");
    if (local_30 == (FILE *)0x0) {
      if (local_28 != (undefined8 *)0x0) {
        *local_28 = "Cannot read file.";
      }
      local_4 = -6;
    }
    else {
      this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
      fseek(local_30,0,2);
      local_38 = ftell(local_30);
      fseek(local_30,(long)this,0);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x159589);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (this,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1595a9);
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_50,0);
      exr_image_00 = (EXRImage *)fread(__ptr,1,local_38,local_30);
      fclose(local_30);
      exr_header_00 =
           (EXRHeader *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (local_10,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_4 = LoadEXRImageFromMemory(exr_image_00,exr_header_00,local_18,(char **)local_10);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)exr_header_00);
    }
  }
  return local_4;
}

Assistant:

int LoadEXRImageFromFile(EXRImage *exr_image, const EXRHeader *exr_header,
                         const char *filename, const char **err) {
  if (exr_image == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "rb");
#else
  FILE *fp = fopen(filename, "rb");
#endif
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);
    (void)ret;
  }

  return LoadEXRImageFromMemory(exr_image, exr_header, &buf.at(0), err);
}